

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCADeserialization.h
# Opt level: O1

void __thiscall
Js::DeserializationCloner<Js::StreamReader>::ReadObjectPropertiesIntoBag
          (DeserializationCloner<Js::StreamReader> *this,SCAPropBag *m_propbag)

{
  scaposition_t src;
  HRESULT hr;
  char16 *name;
  Engine *this_00;
  Var local_40;
  Var value;
  charcount_t len;
  
  value._4_4_ = 0;
  name = TryReadString(this,(charcount_t *)((long)&value + 4),false);
  if (name == (char16 *)0x0) {
    return;
  }
  this_00 = ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
            ::GetEngine(&this->
                         super_ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
                       );
  src = StreamReader::GetPosition(this->m_reader);
  SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_>::Clone
            (this_00,src,&local_40);
  if (local_40 != (Var)0x0) {
    hr = SCAPropBag::InternalAddNoCopy(m_propbag,name,value._4_4_,local_40);
    ScriptContextHolder::ThrowIfFailed(&m_propbag->super_ScriptContextHolder,hr);
  }
  ScriptContextHolder::ThrowSCADataCorrupt((ScriptContextHolder *)this);
}

Assistant:

void ReadObjectPropertiesIntoBag(SCAPropBag* m_propbag)
        {
            for (;;)
            {
                charcount_t len = 0;
                // NOTE: we will not reuse buffer here since the propbag may retain the string.
                const char16* name = TryReadString(&len, /*reuseBuffer*/ false);
                if (!name)
                {
                    break;
                }

                Var value;
                this->GetEngine()->Clone(m_reader->GetPosition(), &value);
                if (!value)
                {
                    this->ThrowSCADataCorrupt();
                }

                HRESULT hr = m_propbag->InternalAddNoCopy(name, len, value);
                m_propbag->ThrowIfFailed(hr);
            }
        }